

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

void __thiscall
fasttext::FastText::skipgram
          (FastText *this,Model *model,real lr,vector<int,_std::allocator<int>_> *line)

{
  pointer piVar1;
  result_type_conflict1 rVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  uniform_int_distribution<int> uniform;
  uniform_int_distribution<int> local_50;
  minstd_rand *local_48;
  FastText *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  local_50._M_param._M_b =
       ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ws;
  local_50._M_param._M_a = 1;
  if ((line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
     ) {
    local_48 = &model->rng;
    uVar4 = 0;
    local_40 = this;
    do {
      rVar2 = std::uniform_int_distribution<int>::operator()(&local_50,local_48,&local_50._M_param);
      local_38 = Dictionary::getNgrams
                           ((local_40->dict_).
                            super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start[uVar4]);
      if (-1 < rVar2) {
        iVar5 = 0;
        do {
          if ((rVar2 != iVar5) && (uVar3 = ((int)uVar4 - rVar2) + iVar5, -1 < (int)uVar3)) {
            piVar1 = (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)uVar3 <
                (ulong)((long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar1 >> 2)) {
              Model::update(model,local_38,piVar1[uVar3],lr);
            }
          }
          iVar5 = iVar5 + 1;
        } while (rVar2 * 2 + 1 != iVar5);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
  }
  return;
}

Assistant:

void FastText::skipgram(Model& model, real lr,
                        const std::vector<int32_t>& line) {
  std::uniform_int_distribution<> uniform(1, args_->ws);
  for (int32_t w = 0; w < line.size(); w++) {
    int32_t boundary = uniform(model.rng);
    const std::vector<int32_t>& ngrams = dict_->getNgrams(line[w]);
    for (int32_t c = -boundary; c <= boundary; c++) {
      if (c != 0 && w + c >= 0 && w + c < line.size()) {
        model.update(ngrams, line[w + c], lr);
      }
    }
  }
}